

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfElseReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp,Sinkables *ifTrue)

{
  _Rb_tree_header *p_Var1;
  If *__x;
  pointer *pppIVar2;
  uintptr_t uVar3;
  Block *pBVar4;
  Expression **ppEVar5;
  Expression *pEVar6;
  size_t sVar7;
  iterator __position;
  Nop *output;
  mapped_type *pmVar8;
  LocalSet *pLVar9;
  size_type sVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  Block *this_00;
  Block *this_01;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Builder local_60;
  Expression **local_58;
  Sinkables *local_50;
  Sinkables *local_48;
  If *local_40;
  If *iff_local;
  Index goodIndex;
  
  local_40 = iff;
  if (iff->ifFalse == (Expression *)0x0) {
    __assert_fail("iff->ifFalse",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x27a,
                  "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  if ((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0) {
    return;
  }
  local_48 = &this->sinkables;
  iff_local._4_4_ = ~_S_red;
  uVar3 = (iff->ifFalse->type).id;
  if ((iff->ifTrue->type).id == 1) {
    if (uVar3 == 1) {
      __assert_fail("iff->ifFalse->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x295,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    if ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return;
    }
    p_Var11 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00b172d2:
    iff_local._4_4_ = p_Var11[1]._M_color;
  }
  else {
    if (uVar3 == 1) {
      if ((ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        return;
      }
      p_Var11 = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      goto LAB_00b172d2;
    }
    p_Var11 = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(ifTrue->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 == p_Var1) {
      return;
    }
    bVar12 = false;
    local_58 = currp;
    local_50 = ifTrue;
    do {
      __x = (If *)(p_Var11 + 1);
      iff = __x;
      sVar10 = std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               ::count(local_48,(key_type *)__x);
      if (sVar10 != 0) {
        iff_local._4_4_ =
             *(_Rb_tree_color *)
              &(__x->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression;
        bVar12 = true;
        break;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    ifTrue = local_50;
    currp = local_58;
    if (!bVar12) {
      return;
    }
  }
  pBVar4 = (Block *)local_40->ifTrue;
  this_01 = (Block *)0x0;
  if ((pBVar4->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId) {
    this_01 = pBVar4;
  }
  uVar3 = (pBVar4->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if ((uVar3 != 1) &&
     ((((this_01 == (Block *)0x0 || ((this_01->name).super_IString.str._M_str != (char *)0x0)) ||
       (sVar7 = (this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements, sVar7 == 0)) ||
      (iff = (If *)(this_01->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data,
      **(char **)((long)iff + sVar7 * 8 + -8) != '\x16')))) {
LAB_00b174c3:
    __position._M_current =
         (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                ((vector<wasm::If*,std::allocator<wasm::If*>> *)&this->ifsToEnlarge,__position,
                 &local_40);
    }
    else {
      *__position._M_current = local_40;
      pppIVar2 = &(this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar2 = *pppIVar2 + 1;
    }
    return;
  }
  pBVar4 = (Block *)local_40->ifFalse;
  this_00 = (Block *)0x0;
  if ((pBVar4->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId) {
    this_00 = pBVar4;
  }
  if (((pBVar4->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1) &&
     (((this_00 == (Block *)0x0 || ((this_00->name).super_IString.str._M_str != (char *)0x0)) ||
      ((sVar7 = (this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements, sVar7 == 0 ||
       (iff = (If *)(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data,
       **(char **)((long)iff + sVar7 * 8 + -8) != '\x16')))))) goto LAB_00b174c3;
  if (uVar3 != 1) {
    pmVar8 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::at(ifTrue,(key_type *)((long)&iff_local + 4));
    ppEVar5 = pmVar8->item;
    pEVar6 = *ppEVar5;
    if (pEVar6->_id != LocalSetId) goto LAB_00b17556;
    sVar7 = (this_01->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar7 == 0) goto LAB_00b17575;
    iff = (If *)(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    *(uintptr_t *)((long)iff + sVar7 * 8 + -8) = pEVar6[1].type.id;
    pEVar6 = *ppEVar5;
    pEVar6->_id = NopId;
    (pEVar6->type).id = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)iff;
    Block::finalize(this_01,type_,Unknown);
    if ((this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 0)
    {
      __assert_fail("ifTrueBlock->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2ca,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
  }
  if ((local_40->ifFalse->type).id != 1) {
    pmVar8 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::at(local_48,(key_type *)((long)&iff_local + 4));
    ppEVar5 = pmVar8->item;
    pEVar6 = *ppEVar5;
    if (pEVar6->_id != LocalSetId) {
LAB_00b17556:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
    }
    sVar7 = (this_00->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar7 == 0) {
LAB_00b17575:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    iff = (If *)(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    *(uintptr_t *)((long)iff + sVar7 * 8 + -8) = pEVar6[1].type.id;
    pEVar6 = *ppEVar5;
    pEVar6->_id = NopId;
    (pEVar6->type).id = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)iff;
    Block::finalize(this_00,type__00,Unknown);
    if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 0)
    {
      __assert_fail("ifFalseBlock->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2d2,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
  }
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)iff;
  If::finalize(local_40,type__01);
  if ((local_40->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0) {
    local_60.wasm =
         (this->
         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
         ).
         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .
         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .
         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .currModule;
    pLVar9 = Builder::makeLocalSet(&local_60,iff_local._4_4_,(Expression *)local_40);
    *currp = (Expression *)pLVar9;
    this->anotherCycle = true;
    return;
  }
  __assert_fail("iff->type != Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                ,0x2d5,
                "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
               );
}

Assistant:

void optimizeIfElseReturn(If* iff, Expression** currp, Sinkables& ifTrue) {
    assert(iff->ifFalse);
    // if this if already has a result, or is unreachable code, we have
    // nothing to do
    if (iff->type != Type::none) {
      return;
    }
    // We now have the sinkables from both sides of the if, and can look
    // for something to sink. That is either a shared index on both sides,
    // *or* if one side is unreachable, we can sink anything from the other,
    //   (if
    //     (..)
    //     (br $x)
    //     (local.set $y (..))
    //   )
    //    =>
    //   (local.set $y
    //     (if (result i32)
    //       (..)
    //       (br $x)
    //       (..)
    //     )
    //   )
    Sinkables& ifFalse = sinkables;
    Index goodIndex = -1;
    bool found = false;
    if (iff->ifTrue->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifFalse->type != Type::unreachable);
      if (!ifFalse.empty()) {
        goodIndex = ifFalse.begin()->first;
        found = true;
      }
    } else if (iff->ifFalse->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifTrue->type != Type::unreachable);
      if (!ifTrue.empty()) {
        goodIndex = ifTrue.begin()->first;
        found = true;
      }
    } else {
      // Look for a shared index.
      for (auto& [index, _] : ifTrue) {
        if (ifFalse.count(index) > 0) {
          goodIndex = index;
          found = true;
          break;
        }
      }
    }
    if (!found) {
      return;
    }
    // great, we can optimize!
    // ensure we have a place to write the return values for, if not, we
    // need another cycle
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (iff->ifTrue->type != Type::unreachable) {
      if (!ifTrueBlock || ifTrueBlock->name.is() ||
          ifTrueBlock->list.size() == 0 ||
          !ifTrueBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    auto* ifFalseBlock = iff->ifFalse->dynCast<Block>();
    if (iff->ifFalse->type != Type::unreachable) {
      if (!ifFalseBlock || ifFalseBlock->name.is() ||
          ifFalseBlock->list.size() == 0 ||
          !ifFalseBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    // all set, go
    if (iff->ifTrue->type != Type::unreachable) {
      auto* ifTrueItem = ifTrue.at(goodIndex).item;
      ifTrueBlock->list[ifTrueBlock->list.size() - 1] =
        (*ifTrueItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifTrueItem);
      ifTrueBlock->finalize();
      assert(ifTrueBlock->type != Type::none);
    }
    if (iff->ifFalse->type != Type::unreachable) {
      auto* ifFalseItem = ifFalse.at(goodIndex).item;
      ifFalseBlock->list[ifFalseBlock->list.size() - 1] =
        (*ifFalseItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifFalseItem);
      ifFalseBlock->finalize();
      assert(ifFalseBlock->type != Type::none);
    }
    iff->finalize(); // update type
    assert(iff->type != Type::none);
    // finally, create a local.set on the iff itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(goodIndex, iff);
    *currp = newLocalSet;
    anotherCycle = true;
  }